

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O0

PClassActor * FindClassTentative(char *name,PClass *ancestor,bool optional)

{
  PClass *pPVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  FName local_34;
  PClassActor *local_30;
  PClass *cls;
  PClass *pPStack_20;
  bool optional_local;
  PClass *ancestor_local;
  char *name_local;
  
  if (((name != (char *)0x0) && (*name != '\0')) &&
     (cls._7_1_ = optional, pPStack_20 = ancestor, ancestor_local = (PClass *)name,
     iVar3 = strcasecmp(name,"none"), pPVar1 = pPStack_20, iVar3 != 0)) {
    FName::FName(&local_34,(char *)ancestor_local);
    local_30 = (PClassActor *)PClass::FindClassTentative(pPVar1,&local_34);
    if (local_30 != (PClassActor *)0x0) {
      bVar2 = PClass::IsDescendantOf((PClass *)local_30,pPStack_20);
      pPVar1 = ancestor_local;
      if (!bVar2) {
        pcVar4 = FName::GetChars(&(pPStack_20->super_PNativeStruct).super_PStruct.super_PNamedType.
                                  TypeName);
        I_Error("%s does not inherit from %s\n",pPVar1,pcVar4);
      }
      if ((*(int *)((long)&(local_30->super_PClass).super_PNativeStruct.super_PStruct.
                           super_PNamedType.super_PCompoundType.super_PType.super_PTypeBase.
                           super_DObject + 0x24) == -1) && ((cls._7_1_ & 1) != 0)) {
        *(uint32 *)
         ((long)&(local_30->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                 super_PCompoundType.super_PType.super_PTypeBase.super_DObject + 0x20) =
             *(uint32 *)
              ((long)&(local_30->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                      super_PCompoundType.super_PType.super_PTypeBase.super_DObject + 0x20) | 0x800;
      }
      return local_30;
    }
    __assert_fail("cls != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef_properties.cpp"
                  ,0x5b,"PClassActor *FindClassTentative(const char *, PClass *, bool)");
  }
  return (PClassActor *)0x0;
}

Assistant:

static PClassActor *FindClassTentative(const char *name, PClass *ancestor, bool optional = false)
{
	// "" and "none" mean 'no class'
	if (name == NULL || *name == 0 || !stricmp(name, "none"))
	{
		return NULL;
	}

	PClass *cls = ancestor->FindClassTentative(name);
	assert(cls != NULL);	// cls can not be NULL here
	if (!cls->IsDescendantOf(ancestor))
	{
		I_Error("%s does not inherit from %s\n", name, ancestor->TypeName.GetChars());
	}
	if (cls->Size == TentativeClass && optional)
	{
		cls->ObjectFlags |= OF_Transient;	// since this flag has no meaning in class types, let's use it for marking the type optional.
	}
	return static_cast<PClassActor *>(cls);
}